

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

void __thiscall Clasp::Solver::updateVars(Solver *this)

{
  uint32 uVar1;
  uint32 uVar2;
  Assignment *in_RDI;
  ConstraintDB *in_stack_000000d8;
  bool in_stack_000000e3;
  uint32 in_stack_000000e4;
  Solver *in_stack_000000e8;
  size_type *this_00;
  uint32 in_stack_ffffffffffffffbc;
  size_type in_stack_ffffffffffffffcc;
  pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
  *in_stack_ffffffffffffffd0;
  
  uVar1 = numVars((Solver *)0x1e6428);
  uVar2 = SharedContext::numVars((SharedContext *)0x1e643c);
  if (uVar2 < uVar1) {
    numVars((Solver *)0x1e6450);
    SharedContext::numVars((SharedContext *)0x1e6464);
    popVars(in_stack_000000e8,in_stack_000000e4,in_stack_000000e3,in_stack_000000d8);
  }
  else {
    SharedContext::numVars((SharedContext *)0x1e649f);
    Assignment::resize(in_RDI,in_stack_ffffffffffffffbc);
    this_00 = &in_RDI[3].pref_.ebo_.size;
    Assignment::numVars((Assignment *)0x1e64c5);
    bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>::left_right_sequence
              ((left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U> *)this_00);
    bk_lib::
    pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
    ::resize(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
             (left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U> *)in_RDI);
    bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>::~left_right_sequence
              ((left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U> *)0x1e64f9);
  }
  return;
}

Assistant:

void Solver::updateVars() {
	if (numVars() > shared_->numVars()) {
		popVars(numVars() - shared_->numVars(), false, 0);
	}
	else {
		assign_.resize(shared_->numVars() + 1);
		watches_.resize(assign_.numVars()<<1);
	}
}